

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

dynlink ext_loader_impl_load_from_file_dynlink(char *path,char *library_name)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  path lib_path;
  dynlink_name_impl platform_name;
  path *in_stack_ffffffffffffef90;
  char (*__source) [4096];
  undefined4 in_stack_ffffffffffffefb0;
  undefined4 in_stack_ffffffffffffefb4;
  format in_stack_ffffffffffffefe7;
  char **in_stack_ffffffffffffefe8;
  path *in_stack_ffffffffffffeff0;
  path *local_8;
  
  __source = (char (*) [4096])&stack0xffffffffffffefe8;
  dynlink_platform_name(in_RSI);
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe7);
  std::filesystem::__cxx11::path::operator/=
            ((path *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),__source);
  bVar1 = std::filesystem::exists(in_stack_ffffffffffffef90);
  if (bVar1) {
    in_stack_ffffffffffffef90 = (path *)dynlink_load(in_RDI,in_RSI,10);
    local_8 = in_stack_ffffffffffffef90;
  }
  else {
    local_8 = (path *)0x0;
  }
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffef90);
  return (dynlink)local_8;
}

Assistant:

dynlink ext_loader_impl_load_from_file_dynlink(const char *path, const char *library_name)
{
	/* This function will try to check if the library exists before loading it,
	so we avoid error messages from dynlink when guessing the file path for relative load from file */
	dynlink_name_impl platform_name;

	dynlink_platform_name(library_name, platform_name);

	fs::path lib_path(path);

	lib_path /= platform_name;

	if (fs::exists(lib_path) == false)
	{
		return NULL;
	}

	return dynlink_load(path, library_name, DYNLINK_FLAGS_BIND_LAZY | DYNLINK_FLAGS_BIND_GLOBAL);
}